

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O3

uint16_t gpio_read(uint32_t address)

{
  gbabus_t *pgVar1;
  gpio_port_t gVar2;
  byte bVar3;
  uint16_t extraout_AX;
  uint16_t extraout_AX_00;
  uint16_t uVar4;
  int iVar5;
  uint uVar7;
  ulong in_RSI;
  char *pcVar8;
  ulong uVar6;
  
  pcVar8 = (char *)(ulong)address;
  uVar6 = (ulong)address;
  if (2 < gba_log_verbosity) {
    pcVar8 = "[DEBUG] [GPIO] gpio read from address 0x%08X\n";
    printf("[DEBUG] [GPIO] gpio read from address 0x%08X\n");
    in_RSI = uVar6;
  }
  if (bus->allow_gpio_read == true) {
    uVar7 = address & 0xf;
    if (uVar7 == 8) {
      bVar3 = 1;
      goto LAB_0011f128;
    }
    if (uVar7 == 6) {
      bVar3 = bus->gpio_write_mask;
      goto LAB_0011f128;
    }
    if (uVar7 == 4) {
      if (bus->gpio_device != RTC) {
        gpio_read_cold_1();
        uVar4 = extraout_AX;
        if (2 < gba_log_verbosity) {
          iVar5 = printf("[DEBUG] [GPIO] gpio write 0x%04X to address 0x%08X\n",in_RSI & 0xffff,
                         (ulong)pcVar8 & 0xffffffff);
          uVar4 = (uint16_t)iVar5;
        }
        pgVar1 = bus;
        uVar7 = (uint)pcVar8 & 0xf;
        if (uVar7 == 8) {
          bus->allow_gpio_read = (_Bool)((byte)in_RSI & 1);
          uVar4 = (uint16_t)gba_log_verbosity;
          if ((in_RSI & 1) == 0) {
            if (2 < gba_log_verbosity) {
              pcVar8 = "[DEBUG] [GPIO] GPIO is now UNREADABLE!";
              goto LAB_0011f21c;
            }
          }
          else if (2 < gba_log_verbosity) {
            pcVar8 = "[DEBUG] [GPIO] GPIO is now READABLE!";
LAB_0011f21c:
            iVar5 = puts(pcVar8);
            return (uint16_t)iVar5;
          }
        }
        else if (uVar7 == 6) {
          bus->gpio_write_mask = (uint8_t)(in_RSI & 0xffffff0f);
          uVar6 = in_RSI & 0xffffff0f ^ 0xf;
          uVar4 = (uint16_t)uVar6;
          pgVar1->gpio_read_mask = (uint8_t)uVar6;
          if (2 < gba_log_verbosity) {
            iVar5 = printf("[DEBUG] [GPIO] Set the read mask to 0x%X and the write mask to 0x%X\n",
                           uVar6 & 0xff,in_RSI & 0xf);
            return (uint16_t)iVar5;
          }
        }
        else if (uVar7 == 4) {
          if (bus->gpio_device == RTC) {
            gba_rtc_write((gpio_port_t)((byte)in_RSI & bus->gpio_write_mask),bus->gpio_write_mask);
            return extraout_AX_00;
          }
          gpio_write_cold_1();
          return (uint16_t)CONCAT71((int7)((ulong)bus >> 8),(bus->port).raw);
        }
        return uVar4;
      }
      gVar2 = gba_rtc_read();
      bVar3 = gVar2.raw & bus->gpio_read_mask;
      goto LAB_0011f128;
    }
  }
  bVar3 = 0;
LAB_0011f128:
  return (uint16_t)bVar3;
}

Assistant:

half gpio_read(word address) {
    logdebug("[GPIO] gpio read from address 0x%08X", address);
    if (bus->allow_gpio_read) {
        switch (address & 0xF) {
            case 0x4: // Data
                switch (bus->gpio_device) {
                    case RTC: {
                        gpio_port_t port = gba_rtc_read();
                        return bus->gpio_read_mask & port.raw;
                    }
                    default:
                        logfatal("Read from data port for unimplemented device %d", bus->gpio_device)
                }
                break;
            case 0x6:
                return bus->gpio_write_mask;
            case 0x8:
                return bus->allow_gpio_read & 1;
        }
    }
    return 0;
}